

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O3

int fetch_all_trips_db(feed_db_t *db,trip_t **records)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  trip_t *ptVar4;
  uchar *puVar5;
  long lVar6;
  sqlite3_stmt *stmt;
  trip_t record;
  char qr [152];
  sqlite3_stmt *local_2a0;
  trip_t local_294;
  char local_c8 [152];
  
  uVar2 = count_rows_db(db,"trips");
  if (0 < (int)uVar2) {
    memcpy(local_c8,
           "SELECT route_id, service_id, trip_id,trip_headsign, trip_short_name,direction_id, block_id, shape_id,wheelchair_accessible, bikes_allowed FROM `trips`;"
           ,0x98);
    sqlite3_prepare_v2(db->conn,local_c8,-1,&local_2a0,(char **)0x0);
    ptVar4 = (trip_t *)malloc((ulong)uVar2 * 0x1cc);
    *records = ptVar4;
    uVar1 = 0xffffffff;
    if (ptVar4 != (trip_t *)0x0) {
      lVar6 = 0;
      do {
        iVar3 = sqlite3_step(local_2a0);
        db->rc = iVar3;
        uVar1 = uVar2;
        if (iVar3 != 100) break;
        init_trip(&local_294);
        puVar5 = sqlite3_column_text(local_2a0,0);
        strcpy(local_294.route_id,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_2a0,1);
        strcpy(local_294.service_id,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_2a0,2);
        strcpy(local_294.id,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_2a0,3);
        strcpy(local_294.headsign,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_2a0,4);
        strcpy(local_294.short_name,(char *)puVar5);
        local_294.direction_id = sqlite3_column_int(local_2a0,5);
        puVar5 = sqlite3_column_text(local_2a0,6);
        strcpy(local_294.block_id,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_2a0,7);
        strcpy(local_294.shape_id,(char *)puVar5);
        local_294.wheelchair_accessible = sqlite3_column_int(local_2a0,8);
        local_294.bikes_allowed = sqlite3_column_int(local_2a0,9);
        memcpy((*records)->route_id + lVar6,&local_294,0x1cc);
        lVar6 = lVar6 + 0x1cc;
      } while ((ulong)uVar2 * 0x1cc - lVar6 != 0);
    }
    uVar2 = uVar1;
    sqlite3_finalize(local_2a0);
  }
  return uVar2;
}

Assistant:

int fetch_all_trips_db(feed_db_t *db, trip_t **records) {

    trip_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "trips");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "route_id, service_id, trip_id,"
                    "trip_headsign, trip_short_name,"
                    "direction_id, block_id, shape_id,"
                    "wheelchair_accessible, bikes_allowed "
                "FROM `trips`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_trip(&record);

        strcpy(record.route_id, sqlite3_column_text(stmt, 0));
        strcpy(record.service_id, sqlite3_column_text(stmt, 1));
        strcpy(record.id, sqlite3_column_text(stmt, 2));
        strcpy(record.headsign, sqlite3_column_text(stmt, 3));
        strcpy(record.short_name, sqlite3_column_text(stmt, 4));
        record.direction_id = sqlite3_column_int(stmt, 5);
        strcpy(record.block_id, sqlite3_column_text(stmt, 6));
        strcpy(record.shape_id, sqlite3_column_text(stmt, 7));
        record.wheelchair_accessible = (wheelchair_accessible_t)sqlite3_column_int(stmt, 8);
        record.bikes_allowed = (bikes_allowed_t)sqlite3_column_int(stmt, 9);

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}